

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::prepareFunctionPointers(ErrorsTest *this)

{
  GetTransformFeedbackiv_ProcAddress p_Var1;
  GetTransformFeedbacki_v_ProcAddress p_Var2;
  GetTransformFeedbacki64_v_ProcAddress p_Var3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 *puVar6;
  undefined1 local_190 [384];
  long lVar5;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  p_Var1 = *(GetTransformFeedbackiv_ProcAddress *)(lVar5 + 0xb30);
  this->m_gl_getTransformFeedbackiv = p_Var1;
  p_Var2 = *(GetTransformFeedbacki_v_ProcAddress *)(lVar5 + 0xb28);
  this->m_gl_getTransformFeedbacki_v = p_Var2;
  p_Var3 = *(GetTransformFeedbacki64_v_ProcAddress *)(lVar5 + 0xb20);
  this->m_gl_getTransformFeedbacki64_v = p_Var3;
  if (((p_Var1 != (GetTransformFeedbackiv_ProcAddress)0x0) &&
      (p_Var2 != (GetTransformFeedbacki_v_ProcAddress)0x0)) &&
     (p_Var3 != (GetTransformFeedbacki64_v_ProcAddress)0x0)) {
    return;
  }
  local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_190 + 8),"Function pointers are set to NULL values.",0x29);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_190);
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0;
  __cxa_throw(puVar6,&int::typeinfo,0);
}

Assistant:

void ErrorsTest::prepareFunctionPointers()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching function pointers. */
	m_gl_getTransformFeedbackiv	= (GetTransformFeedbackiv_ProcAddress)gl.getTransformFeedbackiv;
	m_gl_getTransformFeedbacki_v   = (GetTransformFeedbacki_v_ProcAddress)gl.getTransformFeedbacki_v;
	m_gl_getTransformFeedbacki64_v = (GetTransformFeedbacki64_v_ProcAddress)gl.getTransformFeedbacki64_v;

	if ((DE_NULL == m_gl_getTransformFeedbackiv) || (DE_NULL == m_gl_getTransformFeedbacki_v) ||
		(DE_NULL == m_gl_getTransformFeedbacki64_v))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Function pointers are set to NULL values."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}
}